

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  GetterYs<unsigned_short> *pGVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  uint uVar13;
  ImPlotContext *gp;
  float fVar14;
  double dVar15;
  ImVec2 IVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  
  dVar15 = (double)(prim + 1);
  pGVar7 = this->Getter1;
  pGVar8 = this->Getter2;
  iVar5 = pGVar7->Count;
  iVar6 = this->Transformer->YAxis;
  dVar17 = (double)GImPlot->PixelRange[iVar6].Min.x;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar14 = (float)(((pGVar7->XScale * dVar15 + pGVar7->X0) - dVar3) * GImPlot->Mx + dVar17);
  dVar24 = (double)GImPlot->PixelRange[iVar6].Min.y;
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  fVar18 = (float)(((double)*(ushort *)
                             ((long)pGVar7->Ys +
                             (long)(((prim + 1 + pGVar7->Offset) % iVar5 + iVar5) % iVar5) *
                             (long)pGVar7->Stride) - dVar4) * GImPlot->My[iVar6] + dVar24);
  fVar19 = (this->P11).x;
  fVar21 = fVar19 - fVar14;
  IVar16.x = (float)(((dVar15 * pGVar8->XScale + pGVar8->X0) - dVar3) * GImPlot->Mx + dVar17);
  fVar22 = (float)((pGVar8->YRef - dVar4) * GImPlot->My[iVar6] + dVar24);
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar23 = (this->P12).x;
  fVar20 = fVar23 - IVar16.x;
  IVar16.y = fVar22;
  fVar25 = fVar19 * fVar18 - fVar14 * fVar1;
  fVar19 = fVar23 * fVar22 - IVar16.x * fVar2;
  fVar23 = fVar21 * (fVar2 - fVar22) - fVar20 * (fVar1 - fVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  IVar11.y = fVar18;
  IVar11.x = fVar14;
  pIVar9[1].pos = IVar11;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  IVar12.y = ((fVar2 - fVar22) * fVar25 - (fVar1 - fVar18) * fVar19) / fVar23;
  IVar12.x = (fVar25 * fVar20 - fVar21 * fVar19) / fVar23;
  pIVar9[2].pos = IVar12;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  pIVar9[4].pos = IVar16;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = DrawList->_VtxCurrentIdx;
  uVar13 = -(uint)(fVar2 < fVar1 && fVar18 < fVar22 || fVar22 < fVar18 && fVar1 < fVar2) & 1;
  puVar10[1] = DrawList->_VtxCurrentIdx + uVar13 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar13 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar14;
  (this->P11).y = fVar18;
  (this->P12).x = IVar16.x;
  (this->P12).y = fVar22;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }